

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_case21.c
# Opt level: O0

void case21_set_ext_params(xc_func_type *p,double *ext_params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long in_RSI;
  long in_RDI;
  double dVar5;
  int i_1;
  int i;
  int k;
  double dq;
  int nknots;
  double qmax;
  double qmin;
  hyb_gga_xc_case21_params *params;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  int iVar7;
  int iVar8;
  
  piVar4 = *(int **)(in_RDI + 0x178);
  *piVar4 = 3;
  piVar4[1] = 10;
  dVar5 = ((double)-*piVar4 * 1.0) / (double)(piVar4[1] - *piVar4);
  iVar7 = piVar4[1];
  iVar6 = piVar4[1];
  iVar1 = *piVar4;
  iVar2 = piVar4[1];
  iVar3 = *piVar4;
  for (iVar8 = 0; iVar8 < iVar2 + iVar3 + 1; iVar8 = iVar8 + 1) {
    *(double *)(piVar4 + (long)iVar8 * 2 + 2) =
         (double)iVar8 *
         ((((double)iVar7 * 1.0) / (double)(iVar6 - iVar1) - dVar5) / (double)(iVar2 + iVar3)) +
         dVar5;
  }
  for (iVar7 = 0; iVar7 < piVar4[1]; iVar7 = iVar7 + 1) {
    *(undefined8 *)(piVar4 + (long)iVar7 * 2 + 0x1e) = *(undefined8 *)(in_RSI + (long)iVar7 * 8);
  }
  for (iVar6 = 0; iVar6 < piVar4[1]; iVar6 = iVar6 + 1) {
    *(undefined8 *)(piVar4 + (long)iVar6 * 2 + 0x32) =
         *(undefined8 *)(in_RSI + (long)(iVar6 + piVar4[1]) * 8);
  }
  *(undefined8 *)(piVar4 + 0x46) = *(undefined8 *)(in_RSI + (long)(piVar4[1] << 1) * 8);
  *(undefined8 *)(piVar4 + 0x48) = *(undefined8 *)(in_RSI + (long)(piVar4[1] * 2 + 1) * 8);
  *(undefined8 *)(piVar4 + 0x4a) = *(undefined8 *)(in_RSI + (long)(piVar4[1] * 2 + 2) * 8);
  set_ext_params_exx((xc_func_type *)CONCAT44(iVar8,iVar7),
                     (double *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

static void
case21_set_ext_params(xc_func_type *p, const double *ext_params)
{
  assert(p != NULL);
  hyb_gga_xc_case21_params * params = (hyb_gga_xc_case21_params *) p->params;

  /* Set internal parameters */
  params->k = 3;
  params->Nsp = 10;
  double qmin = -params->k*1.0/(params->Nsp - params->k);
  double qmax = params->Nsp*1.0/(params->Nsp - params->k);
  int nknots = params->Nsp + params->k + 1;
  double dq  = (qmax - qmin)/(nknots-1);
  for(int k=0; k<nknots; k++) {
    params->knots[k] = qmin+k*dq;
  }

  /* External parameters */
  for(int i=0;i<params->Nsp;i++)
    params->cx[i] = ext_params[i];
  for(int i=0;i<params->Nsp;i++)
    params->cc[i] = ext_params[i + params->Nsp];
  params->gammax = ext_params[2*params->Nsp];
  params->gammac = ext_params[2*params->Nsp+1];
  params->ax = ext_params[2*params->Nsp+2];

  /* Exact exchange */
  set_ext_params_exx(p, ext_params);
}